

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O0

void __thiscall
F2DDrawer::AddLine(F2DDrawer *this,int x1,int y1,int x2,int y2,int palcolor,uint32 color)

{
  int iVar1;
  FSimpleVertex *pFVar2;
  uchar *puVar3;
  DataGeneric *dg_1;
  undefined1 local_38 [8];
  DataGeneric dg;
  PalEntry p;
  int palcolor_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  F2DDrawer *this_local;
  
  dg.mVertCount = palcolor;
  if (color == 0) {
    dg.mVertIndex = GPalette.BaseColors[palcolor].field_0.d;
  }
  else {
    PalEntry::PalEntry((PalEntry *)&dg.mVertIndex,color);
  }
  dg.mVertIndex = CONCAT13(0xff,(undefined3)dg.mVertIndex);
  std::swap<unsigned_char>((uchar *)((long)&dg.mVertIndex + 2),(uchar *)&dg.mVertIndex);
  local_38._0_4_ = DrawTypeLine;
  local_38._4_4_ = 0x10;
  dg.mLen = 2;
  dg.mType = TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,2);
  pFVar2 = TArray<FSimpleVertex,_FSimpleVertex>::operator[](&this->mVertices,(long)(int)dg.mType);
  FSimpleVertex::Set(pFVar2,(float)x1,(float)y1,0.0,0.0,0.0,(PalEntry)dg.mVertIndex);
  pFVar2 = TArray<FSimpleVertex,_FSimpleVertex>::operator[]
                     (&this->mVertices,(long)(int)(dg.mType + DrawTypeDim));
  FSimpleVertex::Set(pFVar2,(float)x2,(float)y2,0.0,0.0,0.0,(PalEntry)dg.mVertIndex);
  if (this->mLastLineCmd == -1) {
    iVar1 = AddData(this,(DataGeneric *)local_38);
    this->mLastLineCmd = iVar1;
  }
  else {
    puVar3 = TArray<unsigned_char,_unsigned_char>::operator[](&this->mData,(long)this->mLastLineCmd)
    ;
    *(int *)(puVar3 + 0xc) = *(int *)(puVar3 + 0xc) + 2;
  }
  return;
}

Assistant:

void F2DDrawer::AddLine(int x1, int y1, int x2, int y2, int palcolor, uint32 color)
{
	PalEntry p = color ? (PalEntry)color : GPalette.BaseColors[palcolor];
	p.a = 255;
	std::swap(p.r, p.b);

	DataGeneric dg;

	dg.mType = DrawTypeLine;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 2;
	dg.mVertIndex = (int)mVertices.Reserve(2);
	mVertices[dg.mVertIndex].Set(x1, y1, 0, 0, 0, p);
	mVertices[dg.mVertIndex+1].Set(x2, y2, 0, 0, 0, p);

	// Test if we can batch multiple line commands
	if (mLastLineCmd == -1)
	{
		mLastLineCmd = AddData(&dg);
	}
	else
	{
		DataGeneric *dg = (DataGeneric *)&mData[mLastLineCmd];
		dg->mVertCount += 2;
	}
}